

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mspm.cpp
# Opt level: O0

bool __thiscall pg::MSPMSolver::lift(MSPMSolver *this,int node,int target)

{
  bool bVar1;
  int iVar2;
  int pl;
  int d_00;
  int iVar3;
  int iVar4;
  int iVar5;
  int *pm_00;
  ostream *poVar6;
  char *pcVar7;
  int local_60;
  bool ch1;
  bool ch0;
  int i;
  int to_1;
  int *curedge_1;
  int best_to;
  int to;
  int *curedge;
  int local_38;
  int best_ch1;
  int best_ch0;
  int d;
  int pl_min;
  int pl_max;
  int *pm;
  int target_local;
  int node_local;
  MSPMSolver *this_local;
  
  pm_00 = this->pms + this->k * node;
  if ((*pm_00 == -1) && (pm_00[1] == -1)) {
    this_local._7_1_ = false;
  }
  else {
    this->lift_attempt = this->lift_attempt + 1;
    iVar2 = Solver::owner(&this->super_Solver,node);
    pl = 1 - iVar2;
    d_00 = Solver::priority(&this->super_Solver,node);
    if (1 < (this->super_Solver).trace) {
      poVar6 = std::operator<<((this->super_Solver).logger,"\x1b[1mupdating node ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,node);
      poVar6 = std::operator<<(poVar6,"/");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,d_00);
      iVar3 = Solver::owner(&this->super_Solver,node);
      pcVar7 = " (even)";
      if (iVar3 != 0) {
        pcVar7 = " (odd)";
      }
      poVar6 = std::operator<<(poVar6,pcVar7);
      std::operator<<(poVar6,"\x1b[m with current progress measure");
      pm_stream(this,(this->super_Solver).logger,pm_00);
      std::ostream::operator<<((this->super_Solver).logger,std::endl<char,std::char_traits<char>>);
    }
    local_38 = -1;
    curedge._4_4_ = -1;
    iVar3 = local_38;
    if (pm_00[iVar2] != -1) {
      if (1 < (this->super_Solver).trace) {
        poVar6 = std::operator<<((this->super_Solver).logger,"computing max");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      }
      if (1 < (this->super_Solver).trace) {
        pm_copy(this,this->tmp,pm_00,1 - iVar2);
      }
      if (target == -1) {
        for (_best_to = Solver::outs(&this->super_Solver,node); iVar3 = local_38, *_best_to != -1;
            _best_to = _best_to + 1) {
          iVar3 = *_best_to;
          iVar4 = local_38;
          if (this->cover[iVar3] != -2) {
            Prog(this,this->tmp,this->pms + this->k * iVar3,d_00,iVar2);
            if (1 < (this->super_Solver).trace) {
              poVar6 = std::operator<<((this->super_Solver).logger,"successor node ");
              poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar3);
              poVar6 = std::operator<<(poVar6,"/");
              iVar5 = Solver::priority(&this->super_Solver,iVar3);
              poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar5);
              std::operator<<(poVar6," results in");
              pm_stream(this,(this->super_Solver).logger,this->tmp);
              std::ostream::operator<<
                        ((this->super_Solver).logger,std::endl<char,std::char_traits<char>>);
            }
            bVar1 = pm_less(this,pm_00,this->tmp,d_00,iVar2);
            if ((bVar1) && (pm_copy(this,pm_00,this->tmp,iVar2), iVar4 = iVar3, iVar2 != 0)) {
              curedge._4_4_ = iVar3;
              iVar4 = local_38;
            }
          }
          local_38 = iVar4;
        }
      }
      else {
        Prog(this,this->tmp,this->pms + this->k * target,d_00,iVar2);
        if (1 < (this->super_Solver).trace) {
          poVar6 = std::operator<<((this->super_Solver).logger,"successor node ");
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,target);
          poVar6 = std::operator<<(poVar6,"/");
          iVar4 = Solver::priority(&this->super_Solver,target);
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar4);
          std::operator<<(poVar6," results in");
          pm_stream(this,(this->super_Solver).logger,this->tmp);
          std::ostream::operator<<
                    ((this->super_Solver).logger,std::endl<char,std::char_traits<char>>);
        }
        bVar1 = pm_less(this,pm_00,this->tmp,d_00,iVar2);
        if ((bVar1) && (pm_copy(this,pm_00,this->tmp,iVar2), iVar3 = target, iVar2 != 0)) {
          curedge._4_4_ = target;
          iVar3 = local_38;
        }
      }
    }
    local_38 = iVar3;
    if ((pm_00[pl] != -1) && ((target == -1 || (target == this->strategy[node])))) {
      if (1 < (this->super_Solver).trace) {
        poVar6 = std::operator<<((this->super_Solver).logger,"computing min");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      }
      if (1 < (this->super_Solver).trace) {
        pm_copy(this,this->tmp,pm_00,1 - pl);
      }
      curedge_1._0_4_ = -1;
      for (_i = Solver::outs(&this->super_Solver,node); *_i != -1; _i = _i + 1) {
        iVar2 = *_i;
        if (this->cover[iVar2] != -2) {
          Prog(this,this->tmp,this->pms + this->k * iVar2,d_00,pl);
          if (1 < (this->super_Solver).trace) {
            poVar6 = std::operator<<((this->super_Solver).logger,"successor node ");
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar2);
            poVar6 = std::operator<<(poVar6,"/");
            iVar3 = Solver::priority(&this->super_Solver,iVar2);
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar3);
            std::operator<<(poVar6," results in");
            pm_stream(this,(this->super_Solver).logger,this->tmp);
            std::ostream::operator<<
                      ((this->super_Solver).logger,std::endl<char,std::char_traits<char>>);
          }
          if (((int)curedge_1 == -1) || (bVar1 = pm_less(this,this->tmp,this->best,d_00,pl), bVar1))
          {
            for (local_60 = 0; curedge_1._0_4_ = iVar2, local_60 < this->k; local_60 = local_60 + 1)
            {
              this->best[local_60] = this->tmp[local_60];
            }
          }
        }
      }
      this->strategy[node] = (int)curedge_1;
      bVar1 = pm_less(this,pm_00,this->best,d_00,pl);
      if (bVar1) {
        pm_copy(this,pm_00,this->best,pl);
        if (pl == 0) {
          local_38 = (int)curedge_1;
        }
        else {
          curedge._4_4_ = (int)curedge_1;
        }
      }
    }
    if ((local_38 != -1) || (curedge._4_4_ != -1)) {
      if ((this->super_Solver).trace != 0) {
        poVar6 = std::operator<<((this->super_Solver).logger,"\x1b[1;32mupdated node ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,node);
        poVar6 = std::operator<<(poVar6,"/");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,d_00);
        iVar2 = Solver::owner(&this->super_Solver,node);
        pcVar7 = " (even)";
        if (iVar2 != 0) {
          pcVar7 = " (odd)";
        }
        poVar6 = std::operator<<(poVar6,pcVar7);
        std::operator<<(poVar6,"\x1b[m to");
        pm_stream(this,(this->super_Solver).logger,pm_00);
        std::ostream::operator<<((this->super_Solver).logger,std::endl<char,std::char_traits<char>>)
        ;
      }
      if ((local_38 != -1) && (*pm_00 == -1)) {
        solve(this,node,local_38);
      }
      if ((curedge._4_4_ != -1) && (pm_00[1] == -1)) {
        solve(this,node,curedge._4_4_);
      }
      this->lift_count = this->lift_count + 1;
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool
MSPMSolver::lift(int node, int target)
{
    // obtain ptr to current progress measure
    int *pm = pms + k*node;

    // check if already Top for both players
    if (pm[0] == -1 and pm[1] == -1) return false;

    lift_attempt++;

    // initialize stuff
    const int pl_max = owner(node);
    const int pl_min = 1 - pl_max;
    const int d = priority(node);

    if (trace >= 2) {
        logger << "\033[1mupdating node " << node << "/" << d << (owner(node)?" (odd)":" (even)") << "\033[m with current progress measure";
        pm_stream(logger, pm);
        logger << std::endl;
    }

    int best_ch0 = -1, best_ch1 = -1;

    // do max for player <pl_max>
    if (pm[pl_max] != -1) {
        if (trace >= 2) logger << "computing max" << std::endl;
        if (trace >= 2) pm_copy(tmp, pm, 1-pl_max);

        if (target != -1) {
            // just look at target
            Prog(tmp, pms + k*target, d, pl_max);

            if (trace >= 2) {
                logger << "successor node " << target << "/" << priority(target) << " results in";
                pm_stream(logger, tmp);
                logger << std::endl;
            }

            if (pm_less(pm, tmp, d, pl_max)) {
                pm_copy(pm, tmp, pl_max);
                if (pl_max) best_ch1 = target;
                else best_ch0 = target;
            }
        } else {
            for (auto curedge = outs(node); *curedge != -1; curedge++) {
                int to = *curedge;
                if (cover[to] == -2) continue;
                Prog(tmp, pms + k*to, d, pl_max);

                if (trace >= 2) {
                    logger << "successor node " << to << "/" << priority(to) << " results in";
                    pm_stream(logger, tmp);
                    logger << std::endl;
                }

                if (pm_less(pm, tmp, d, pl_max)) {
                    pm_copy(pm, tmp, pl_max);
                    if (pl_max) best_ch1 = to;
                    else best_ch0 = to;
                }
            }
        }
    }

    // do min for player <pl_min>
    if (pm[pl_min] != -1 and (target == -1 or target == strategy[node])) {
        if (trace >= 2) logger << "computing min" << std::endl;
        if (trace >= 2) pm_copy(tmp, pm, 1-pl_min);
        int best_to = -1;
        for (auto curedge = outs(node); *curedge != -1; curedge++) {
            int to = *curedge;
            if (cover[to] == -2) continue;
            Prog(tmp, pms + k*to, d, pl_min);

            if (trace >= 2) {
                logger << "successor node " << to << "/" << priority(to) << " results in";
                pm_stream(logger, tmp);
                logger << std::endl;
            }

            if (best_to == -1 or pm_less(tmp, best, d, pl_min)) {
                for (int i=0; i<k; i++) best[i] = tmp[i];
                best_to = to;
            }
        }

        strategy[node] = best_to;
        // note: sometimes only the strategy changes, but the lowest pm stays the same
        // now "best" contains the smallest Prog, which may be higher than the current min
        if (pm_less(pm, best, d, pl_min)) {
            pm_copy(pm, best, pl_min);
            if (pl_min) best_ch1 = best_to;
            else best_ch0 = best_to;
        }
    }

    bool ch0 = best_ch0 != -1;
    bool ch1 = best_ch1 != -1;

    if (ch0 or ch1) {
        if (trace) {
            logger << "\033[1;32mupdated node " << node << "/" << d << (owner(node)?" (odd)":" (even)") << "\033[m to";
            pm_stream(logger, pm);
            logger << std::endl;
        }
        // check if a changed pm is now Top
        if (ch0 and pm[0] == -1) solve(node, best_ch0);
        if (ch1 and pm[1] == -1) solve(node, best_ch1);
        // increase count and return true
        lift_count++;
        return true;
    } else {
        return false;
    }
}